

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple16.h
# Opt level: O0

bool FastPForLib::Simple16<true>::tryme<2u,4u,4u,5u>(uint32_t *n,size_t len)

{
  int local_30;
  uint local_2c;
  uint32_t i_1;
  uint32_t min2;
  uint32_t i;
  uint32_t min1;
  size_t len_local;
  uint32_t *n_local;
  
  local_2c = (uint)len;
  if (1 < len) {
    local_2c = 2;
  }
  for (i = 0; i < local_2c; i = i + 1) {
    if (0xf < n[i]) {
      return false;
    }
  }
  if (len - local_2c < 4) {
    local_30 = (uint)len - local_2c;
  }
  else {
    local_30 = 4;
  }
  i_1 = local_2c;
  while( true ) {
    if (local_2c + local_30 <= i_1) {
      return true;
    }
    if (0x1f < n[i_1]) break;
    i_1 = i_1 + 1;
  }
  return false;
}

Assistant:

static bool tryme(const uint32_t *n, size_t len) {
    const uint32_t min1 = (len < num1) ? static_cast<uint32_t>(len) : num1;
    for (uint32_t i = 0; i < min1; i++) {
      if ((n[i]) >= (1U << log1))
        return false;
    }
    const uint32_t min2 =
        (len - min1 < num2) ? static_cast<uint32_t>(len - min1) : num2;
    for (uint32_t i = min1; i < min1 + min2; i++) {
      if ((n[i]) >= (1U << log2))
        return false;
    }
    return true;
  }